

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::LineWidthParamTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineWidthParamTestInstance *this)

{
  Context *this_00;
  TestLog *pTVar1;
  DeviceInterface *pDVar2;
  Image *this_01;
  double dVar3;
  TestStatus *pTVar4;
  bool bVar5;
  VkResult result;
  VkQueue pVVar6;
  InstanceInterface *pIVar7;
  VkPhysicalDevice pVVar8;
  Allocator *allocator;
  int y;
  int x;
  float fVar9;
  float fVar10;
  long *local_4b8;
  long local_4b0;
  long local_4a8 [2];
  undefined8 local_498;
  undefined4 local_490;
  TestLog *local_488;
  TestStatus *local_480;
  VkQueue local_478;
  double local_470;
  double local_468;
  double local_460;
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  VkPhysicalDeviceProperties deviceProperties;
  
  this_00 = (this->super_DynamicStateBaseClass).super_TestInstance.m_context;
  pTVar1 = this_00->m_testCtx->m_log;
  local_480 = __return_storage_ptr__;
  pVVar6 = Context::getUniversalQueue(this_00);
  DynamicStateBaseClass::beginRenderPass(&this->super_DynamicStateBaseClass);
  pIVar7 = Context::getInstanceInterface
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pVVar8 = Context::getPhysicalDevice
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  (*pIVar7->_vptr_InstanceInterface[5])(pIVar7,pVVar8,&deviceProperties);
  DynamicStateBaseClass::setDynamicViewportState(&this->super_DynamicStateBaseClass,0x80,0x80);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  fVar9 = floorf(deviceProperties.limits.lineWidthRange[1]);
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,fVar9,0.0,0.0,0.0);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DynamicStateBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x59])
            (pDVar2,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)((long)(this->super_DynamicStateBaseClass).m_data.
                           super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_DynamicStateBaseClass).m_data.
                          super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,pVVar6,1);
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  local_478 = pVVar6;
  result = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,pVVar6);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateRSTests.cpp"
                    ,0x290);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  local_488 = pTVar1;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_460 = (double)referenceFrame.m_height;
    local_470 = local_460 * 0.5;
    local_468 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    do {
      fVar9 = (float)((double)y / local_470) + -1.0;
      if (0 < referenceFrame.m_width) {
        x = 0;
        do {
          dVar3 = (double)x / local_468;
          fVar10 = floorf(deviceProperties.limits.lineWidthRange[1]);
          if (((fVar9 <= (float)((double)fVar10 / local_460)) && (ABS((float)dVar3 + -1.0) <= 1.0))
             && (-(float)((double)fVar10 / local_460) <= fVar9)) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = 0x3f800000;
            renderedFrame.m_size.m_data[0] = 0;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (this->super_DynamicStateBaseClass).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_490 = 0;
  local_498 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_478,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar5 = tcu::fuzzyCompare(local_488,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar4 = local_480;
  local_4b8 = local_4a8;
  if (bVar5) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,"Image verification passed","");
    pTVar4->m_code = QP_TEST_RESULT_PASS;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_4b8,local_4b0 + (long)local_4b8);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,"Image verification failed","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_4b8,local_4b0 + (long)local_4b8);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar4;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log		= m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		vk::VkPhysicalDeviceProperties deviceProperties;
		m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicBlendState();
		setDynamicDepthStencilState();
		setDynamicRasterizationState(deFloatFloor(deviceProperties.limits.lineWidthRange[1]));

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset	= 0;
		const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;
					float lineHalfWidth = (float)(deFloor(deviceProperties.limits.lineWidthRange[1]) / frameHeight);

					if (xCoord >= -1.0f && xCoord <= 1.0f && yCoord >= -lineHalfWidth && yCoord <= lineHalfWidth)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
																							  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT,
																							  vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}